

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

long GetStreamWriteAvailable(PaStream *s)

{
  int iVar1;
  int iVar2;
  snd_pcm_sframes_t sVar3;
  pthread_t __thread1;
  char *errorText;
  int __pa_unsure_error_id;
  snd_pcm_sframes_t savail;
  unsigned_long uStack_30;
  int xrun;
  unsigned_long avail;
  PaAlsaStream *stream;
  PaStream *pPStack_18;
  PaError result;
  PaStream *s_local;
  
  stream._4_4_ = 0;
  avail = (unsigned_long)s;
  pPStack_18 = s;
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                         ((PaAlsaStreamComponent *)((long)s + 0x308),&stack0xffffffffffffffd0,
                          (int *)((long)&savail + 4));
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &stream->playback, &avail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4517\n"
                     );
    stream._4_4_ = paUtilErr_;
  }
  else {
    if (savail._4_4_ == 0) {
      return uStack_30;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun((PaAlsaStream *)avail);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( stream )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4522\n"
                       );
      stream._4_4_ = paUtilErr_;
    }
    else {
      sVar3 = (*alsa_snd_pcm_avail_update)(*(snd_pcm_t **)(avail + 0x340));
      iVar1 = (int)sVar3;
      if (-1 < iVar1) {
        return sVar3;
      }
      __thread1 = pthread_self();
      iVar2 = pthread_equal(__thread1,paUnixMainThread);
      if (iVar2 != 0) {
        errorText = (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,errorText);
      }
      PaUtil_DebugPrint(
                       "Expression \'savail\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4526\n"
                       );
      stream._4_4_ = -9999;
    }
  }
  return (long)stream._4_4_;
}

Assistant:

static signed long GetStreamWriteAvailable( PaStream* s )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    unsigned long avail;
    int xrun;

    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &stream->playback, &avail, &xrun ) );
    if( xrun )
    {
        snd_pcm_sframes_t savail;

        PA_ENSURE( PaAlsaStream_HandleXrun( stream ) );
        savail = alsa_snd_pcm_avail_update( stream->playback.pcm );

        /* savail should not contain -EPIPE now, since PaAlsaStream_HandleXrun will only prepare the pcm */
        ENSURE_( savail, paUnanticipatedHostError );

        avail = (unsigned long) savail;
    }

    return (signed long)avail;

error:
    return result;
}